

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithHeartAsTrump.h
# Opt level: O2

void __thiscall WithHeartAsTrump::WithHeartAsTrump(WithHeartAsTrump *this)

{
  initializer_list<Card> __l;
  allocator_type local_81;
  _Vector_base<Card,_std::allocator<Card>_> local_80;
  Card local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_DifferentTrumpRule).super_Rule._vptr_Rule = (_func_int **)&PTR_isTrump_0010ec60;
  local_68.m_suit = HEARTS;
  local_68.m_value = NINE;
  uStack_60 = 0x300000001;
  local_58 = 0x500000001;
  uStack_50 = 0x100000000;
  local_48 = 0x100000002;
  uStack_40 = 0x100000003;
  local_38 = 0x200000000;
  uStack_30 = 0x200000001;
  local_28 = 0x200000002;
  uStack_20 = 0x200000003;
  local_18 = 0x400000001;
  __l._M_len = 0xb;
  __l._M_array = &local_68;
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&local_80,__l,&local_81);
  std::vector<Card,_std::allocator<Card>_>::_M_move_assign
            (&(this->super_DifferentTrumpRule).m_trumpCards,&local_80);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_80);
  return;
}

Assistant:

WithHeartAsTrump() {
        m_trumpCards = std::vector<Card>{
                Card(Suit::HEARTS, CardValue::NINE),
                Card(Suit::HEARTS, CardValue::KING),
                Card(Suit::HEARTS, CardValue::ASS),
                Card(Suit::DIAMONDS, CardValue::JACK),
                Card(Suit::SPADES, CardValue::JACK),
                Card(Suit::CLUBS, CardValue::JACK),
                Card(Suit::DIAMONDS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::QUEEN),
                Card(Suit::SPADES, CardValue::QUEEN),
                Card(Suit::CLUBS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::TEN)};
    }